

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O2

MixMode __thiscall
trackerboy::apu::Hardware::preRunChannel
          (Hardware *this,size_t index,Channel *ch,Mixer *mixer,uint32_t cycletime)

{
  if ((ch->mDacOn == true) && (ch->mEnabled == true)) {
    return (this->mMix)._M_elems[index];
  }
  silence(this,index,mixer,cycletime);
  return mute;
}

Assistant:

MixMode Hardware::preRunChannel(size_t index, Channel &ch, Mixer &mixer, uint32_t cycletime) noexcept {
    if (ch.isDacOn() && ch.isEnabled()) {
        return mMix[index];
    }

    // no mixing required, either the channel's DAC is off or
    // the length counter disabled the channel
    silence(index, mixer, cycletime);
    return MixMode::mute;

}